

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void printfmt<char_const*,unsigned_int,unsigned_int>
               (ostream *out,char *format,char **arg,uint *args,uint *args_1)

{
  char cVar1;
  char *__s;
  undefined8 in_RAX;
  size_t sVar2;
  char *__s_00;
  undefined8 uStack_38;
  
  __s_00 = format + 6;
  uStack_38 = in_RAX;
  do {
    cVar1 = __s_00[-6];
    if (cVar1 == '{') {
      if (__s_00[-5] == '}') {
        __s = *arg;
        if (__s == (char *)0x0) {
          std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
        }
        else {
          sVar2 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar2);
        }
        do {
          cVar1 = __s_00[-4];
          if (cVar1 == '{') {
            if (__s_00[-3] == '}') {
              std::ostream::_M_insert<unsigned_long>((ulong)out);
              do {
                cVar1 = __s_00[-2];
                if (cVar1 == '{') {
                  if (__s_00[-1] == '}') {
                    std::ostream::_M_insert<unsigned_long>((ulong)out);
                    sVar2 = strlen(__s_00);
                    std::__ostream_insert<char,std::char_traits<char>>(out,__s_00,sVar2);
                    return;
                  }
                }
                else if (cVar1 == '\0') {
                  return;
                }
                uStack_38._0_6_ = CONCAT15(cVar1,(undefined5)uStack_38);
                std::__ostream_insert<char,std::char_traits<char>>
                          (out,(char *)((long)&uStack_38 + 5),1);
                __s_00 = __s_00 + 1;
              } while( true );
            }
          }
          else if (cVar1 == '\0') {
            return;
          }
          uStack_38._0_7_ = CONCAT16(cVar1,(undefined6)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 6),1);
          __s_00 = __s_00 + 1;
        } while( true );
      }
    }
    else if (cVar1 == '\0') {
      return;
    }
    uStack_38 = CONCAT17(cVar1,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 7),1);
    __s_00 = __s_00 + 1;
  } while( true );
}

Assistant:

inline void printfmt(std::ostream& out, const char *format, const T& arg, const Args&... args) {
    char* s = const_cast<char*>(format);
    for (unsigned char ch; (ch = *s) != '\0'; out << *s++) {
        if (ch == '{' && *(s+1) == '}') {
            print(out, arg);
            printfmt(out, s+2, args...);
            break;
        }
    }
}